

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O2

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info,string *command_name,
                         vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *objects_info,bool check_members,bool check_pnext,
                         XrHandMeshVertexBufferMSFT *value)

{
  XrResult XVar1;
  undefined7 in_register_00000009;
  allocator local_72;
  allocator local_71;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_70;
  string local_58;
  string local_38;
  
  XVar1 = XR_SUCCESS;
  if ((((int)CONCAT71(in_register_00000009,check_members) != 0) && (value->vertexCapacityInput != 0)
      ) && (value->vertices == (XrHandMeshVertexMSFT *)0x0)) {
    std::__cxx11::string::string
              ((string *)&local_38,"VUID-XrHandMeshVertexBufferMSFT-vertices-parameter",&local_71);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               &local_70,objects_info);
    std::__cxx11::string::string
              ((string *)&local_58,
               "Structure XrHandMeshVertexBufferMSFT member vertexCapacityInput is NULL, but value->vertexCapacityInput is greater than 0"
               ,&local_72);
    CoreValidLogMessage(instance_info,&local_38,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                        (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *)&local_70,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
    ~_Vector_base(&local_70);
    std::__cxx11::string::~string((string *)&local_38);
    XVar1 = XR_ERROR_VALIDATION_FAILURE;
  }
  return XVar1;
}

Assistant:

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info, const std::string &command_name,
                          std::vector<GenValidUsageXrObjectInfo>& objects_info, bool check_members, bool check_pnext,
                          const XrHandMeshVertexBufferMSFT* value) {
    XrResult xr_result = XR_SUCCESS;
    (void)xr_result;
    (void)instance_info;
    (void)command_name;
    (void)objects_info;
    (void)check_members;
    (void)value;
    // If we are not to check the rest of the members, just return here.
    if (!check_members || XR_SUCCESS != xr_result) {
        return xr_result;
    }
    // Optional array must be non-NULL when value->vertexCapacityInput is non-zero
    if (0 != value->vertexCapacityInput && nullptr == value->vertices) {
        CoreValidLogMessage(instance_info, "VUID-XrHandMeshVertexBufferMSFT-vertices-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info,
                            "Structure XrHandMeshVertexBufferMSFT member vertexCapacityInput is NULL, but value->vertexCapacityInput is greater than 0");
        return XR_ERROR_VALIDATION_FAILURE;
    }
    // NOTE: Can't validate "VUID-XrHandMeshVertexBufferMSFT-vertices-parameter" type
    // Everything checked out properly
    return xr_result;
}